

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example_character.cpp
# Opt level: O0

int main(void)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  undefined4 extraout_var;
  uint64_t prefix;
  uint64_t sub;
  uint64_t packed;
  string str;
  uint64_t *in_stack_fffffffffffffeb8;
  uint64_t *in_stack_fffffffffffffec0;
  size_t in_stack_fffffffffffffed8;
  undefined7 in_stack_fffffffffffffee0;
  undefined1 in_stack_fffffffffffffee7;
  allocator<char> *in_stack_fffffffffffffef0;
  char *in_stack_fffffffffffffef8;
  undefined7 in_stack_ffffffffffffff00;
  undefined1 in_stack_ffffffffffffff07;
  undefined1 local_69;
  undefined8 local_68;
  uint64_t local_60;
  uint64_t local_58;
  uint_fast8_t local_4a [2];
  uint64_t local_48;
  uint64_t local_40 [3];
  allocator<char> local_21;
  string local_20 [32];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00),in_stack_fffffffffffffef8
             ,in_stack_fffffffffffffef0);
  std::allocator<char>::~allocator(&local_21);
  local_40[0] = ::packed::character::construct
                          ((string *)CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0),
                           in_stack_fffffffffffffed8);
  poVar4 = std::operator<<((ostream *)&std::cout,"str = ");
  poVar4 = std::operator<<(poVar4,local_20);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  std::operator<<((ostream *)&std::cout,"packed = str[6..] = ");
  print_packed((uint64_t)in_stack_fffffffffffffec0);
  poVar4 = std::operator<<((ostream *)&std::cout,"|packed| = ");
  bVar1 = ::packed::character::char_length(in_stack_fffffffffffffec0);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,(ulong)bVar1);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  local_4a[1] = 2;
  local_4a[0] = '\x04';
  local_48 = ::packed::character::substring(local_40,local_4a + 1,local_4a);
  std::operator<<((ostream *)&std::cout,"sub = packed[2..2+3] = ");
  print_packed((uint64_t)in_stack_fffffffffffffec0);
  poVar4 = std::operator<<((ostream *)&std::cout,"|sub| = ");
  bVar1 = ::packed::character::char_length(in_stack_fffffffffffffec0);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,(ulong)bVar1);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)&std::cout,"lcp(packed,sub) = ");
  bVar1 = ::packed::character::longest_common_prefix
                    (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,(ulong)bVar1);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)&std::cout,"lcp(str[2..],str[9..]) = ");
  local_58 = ::packed::character::construct
                       ((string *)CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0),
                        in_stack_fffffffffffffed8);
  local_60 = ::packed::character::construct
                       ((string *)CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0),
                        in_stack_fffffffffffffed8);
  bVar1 = ::packed::character::longest_common_prefix
                    (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,(ulong)bVar1);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  local_69 = 4;
  iVar3 = ::packed::character::truncate((char *)local_40,(__off_t)&local_69);
  local_68 = CONCAT44(extraout_var,iVar3);
  std::operator<<((ostream *)&std::cout,"prefix = packed[1..4] = ");
  print_packed((uint64_t)in_stack_fffffffffffffec0);
  poVar4 = std::operator<<((ostream *)&std::cout,"|prefix| = ");
  bVar1 = ::packed::character::char_length(in_stack_fffffffffffffec0);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,(ulong)bVar1);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)&std::cout,"is prefix?: ");
  bVar2 = ::packed::character::is_prefix(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,bVar2);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_20);
  return 0;
}

Assistant:

int main() {
   std::string str = "Hello World!";
   auto packed = C::construct(str, 6); // packed = str[6..]
   std::cout << "str = " << str << std::endl;
   std::cout << "packed = str[6..] = ";
   print_packed(packed);
   std::cout << "|packed| = " << static_cast<size_t>(C::char_length(packed)) << std::endl; 
   auto sub = C::substring(packed, 2,4); // sub = packed[2..2+3]
   std::cout << "sub = packed[2..2+3] = ";
   print_packed(sub); 
   std::cout << "|sub| = " << static_cast<size_t>(C::char_length(sub)) << std::endl; 
   std::cout << "lcp(packed,sub) = " << static_cast<size_t>(C::longest_common_prefix(packed, sub)) << std::endl;

   std::cout << "lcp(str[2..],str[9..]) = " << static_cast<size_t>(C::longest_common_prefix(C::construct(str,2), C::construct(str,9))) << std::endl;

   auto prefix = C::truncate(packed, 4); // prefix = packed[1..4]
   std::cout << "prefix = packed[1..4] = ";
   print_packed(prefix); 
   std::cout << "|prefix| = " << static_cast<size_t>(C::char_length(sub)) << std::endl; 
   std::cout << "is prefix?: " << C::is_prefix(packed, prefix) << std::endl; 


}